

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O1

void __thiscall
jaegertracing::propagation::BinaryPropagator::inject
          (BinaryPropagator *this,SpanContext *ctx,ostream *out)

{
  char cVar1;
  unsigned_long numShiftBits;
  long lVar2;
  _Hash_node_base *p_Var3;
  
  lVar2 = 0x38;
  do {
    cVar1 = (char)out;
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  lVar2 = 0x38;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  lVar2 = 0x38;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  lVar2 = 0x38;
  do {
    std::ostream::put(cVar1);
    lVar2 = lVar2 + -8;
  } while (lVar2 != -8);
  std::ostream::put(cVar1);
  lVar2 = 0x20;
  do {
    lVar2 = lVar2 + -8;
    std::ostream::put(cVar1);
  } while (lVar2 != 0);
  for (p_Var3 = (ctx->_baggage)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    lVar2 = 0x20;
    do {
      lVar2 = lVar2 + -8;
      std::ostream::put(cVar1);
    } while (lVar2 != 0);
    std::ostream::write((char *)out,(long)p_Var3[1]._M_nxt);
    lVar2 = 0x20;
    do {
      lVar2 = lVar2 + -8;
      std::ostream::put(cVar1);
    } while (lVar2 != 0);
    std::ostream::write((char *)out,(long)p_Var3[5]._M_nxt);
  }
  return;
}

Assistant:

void inject(const SpanContext& ctx, std::ostream& out) const override
    {
        writeBinary(out, ctx.traceID().high());
        writeBinary(out, ctx.traceID().low());
        writeBinary(out, ctx.spanID());
        writeBinary(out, ctx.parentID());
        // `flags` is a single byte, so endianness is not an issue.
        out.put(ctx.flags());

        writeBinary(out, static_cast<uint32_t>(ctx.baggage().size()));
        for (auto&& pair : ctx.baggage()) {
            auto&& key = pair.first;
            writeBinary(out, static_cast<uint32_t>(key.size()));
            out.write(key.c_str(), key.size());

            auto&& value = pair.second;
            writeBinary(out, static_cast<uint32_t>(value.size()));
            out.write(value.c_str(), value.size());
        }
    }